

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options_descriptor.cpp
# Opt level: O2

string * __thiscall
program_options::option_description::canonical_display_name_abi_cxx11_
          (string *__return_storage_ptr__,option_description *this,int prefix_style)

{
  option_description *__rhs;
  option_description *poVar1;
  char *__lhs;
  allocator<char> local_31;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  __rhs = (option_description *)
          (this->m_long_names).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
  poVar1 = (option_description *)
           (this->m_long_names).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (__rhs != poVar1) {
    if (prefix_style == 0x1000) {
      __lhs = "-";
LAB_00153d9e:
      std::operator+(__return_storage_ptr__,__lhs,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs);
      return __return_storage_ptr__;
    }
    if (prefix_style == 1) {
      __lhs = "--";
      goto LAB_00153d9e;
    }
  }
  if ((this->m_short_name)._M_string_length == 2) {
    if (prefix_style == 4) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"-",&local_31);
      std::operator+(__return_storage_ptr__,&local_30,(this->m_short_name)._M_dataplus._M_p[1]);
    }
    else {
      if (prefix_style != 8) goto LAB_00153d8a;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"/",&local_31);
      std::operator+(__return_storage_ptr__,&local_30,(this->m_short_name)._M_dataplus._M_p[1]);
    }
    std::__cxx11::string::~string((string *)&local_30);
  }
  else {
LAB_00153d8a:
    if (__rhs != poVar1) {
      this = __rhs;
    }
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)this);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string option_description::canonical_display_name(int prefix_style) const
{
    // We prefer the first long name over any others
    if (!m_long_names.empty())
    {
        if (prefix_style == command_line_style::allow_long)
            return "--" + *m_long_names.begin();
        if (prefix_style == command_line_style::allow_long_disguise)
            return "-" + *m_long_names.begin();
    }
    // sanity check: m_short_name[0] should be '-' or '/'
    if (m_short_name.length() == 2)
    {
        if (prefix_style == command_line_style::allow_slash_for_short)
            return std::string("/") + m_short_name[1];
        if (prefix_style == command_line_style::allow_dash_for_short)
            return std::string("-") + m_short_name[1];
    }
    if (!m_long_names.empty())
        return *m_long_names.begin();
    else
        return m_short_name;
}